

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# japancal.cpp
# Opt level: O0

void __thiscall
icu_63::JapaneseCalendar::handleComputeFields
          (JapaneseCalendar *this,int32_t julianDay,UErrorCode *status)

{
  EraRules *this_00;
  int32_t year_00;
  int32_t iVar1;
  int32_t day;
  int32_t eraIdx;
  int32_t year;
  UErrorCode *status_local;
  int32_t julianDay_local;
  JapaneseCalendar *this_local;
  
  GregorianCalendar::handleComputeFields(&this->super_GregorianCalendar,julianDay,status);
  year_00 = Calendar::internalGet((Calendar *)this,UCAL_EXTENDED_YEAR);
  this_00 = gJapaneseEraRules;
  iVar1 = Calendar::internalGet((Calendar *)this,UCAL_MONTH);
  day = Calendar::internalGet((Calendar *)this,UCAL_DATE);
  iVar1 = EraRules::getEraIndex(this_00,year_00,iVar1 + 1,day,status);
  Calendar::internalSet((Calendar *)this,UCAL_ERA,iVar1);
  iVar1 = EraRules::getStartYear(gJapaneseEraRules,iVar1,status);
  Calendar::internalSet((Calendar *)this,UCAL_YEAR,(year_00 - iVar1) + 1);
  return;
}

Assistant:

void JapaneseCalendar::handleComputeFields(int32_t julianDay, UErrorCode& status)
{
    //Calendar::timeToFields(theTime, quick, status);
    GregorianCalendar::handleComputeFields(julianDay, status);
    int32_t year = internalGet(UCAL_EXTENDED_YEAR); // Gregorian year
    int32_t eraIdx = gJapaneseEraRules->getEraIndex(year, internalGet(UCAL_MONTH) + 1, internalGet(UCAL_DAY_OF_MONTH), status);

    internalSet(UCAL_ERA, eraIdx);
    internalSet(UCAL_YEAR, year - gJapaneseEraRules->getStartYear(eraIdx, status) + 1);
}